

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Vec_IntRemap(Vec_Int_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  if (0 < p->nSize) {
    piVar2 = p->pArray;
    lVar3 = 0;
    do {
      iVar1 = piVar2[lVar3];
      if (((long)iVar1 < 0) || (vMap->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2[lVar3] = vMap->pArray[iVar1];
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nSize);
  }
  return;
}

Assistant:

static inline void Vec_IntRemap( Vec_Int_t * p, Vec_Int_t * vMap )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        p->pArray[i] = Vec_IntEntry(vMap, p->pArray[i]);
}